

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

size_t rcg::getRegister(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,uint8_t *buffer,
                       size_t len,size_t *total,bool exception,bool igncache)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  unsigned_long *puVar5;
  invalid_argument *piVar6;
  undefined8 in_RDX;
  char *in_RSI;
  unsigned_long *in_R8;
  byte in_R9B;
  byte in_stack_00000008;
  GenericException *ex;
  size_t n;
  IRegister *p;
  INode *node;
  size_t ret;
  IBase *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  long *local_1e0;
  allocator local_181;
  string local_180 [32];
  string local_160 [38];
  undefined1 local_13a;
  allocator local_139;
  string local_138 [32];
  string local_118 [38];
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [32];
  string local_d0 [32];
  unsigned_long local_b0;
  long *local_a8;
  gcstring local_90 [80];
  long local_40;
  unsigned_long local_38;
  byte local_2a;
  byte local_29;
  unsigned_long *local_28;
  unsigned_long local_20;
  undefined8 local_18;
  char *local_10;
  long lVar4;
  
  local_29 = in_R9B & 1;
  local_2a = in_stack_00000008 & 1;
  local_38 = 0;
  if (in_R8 != (unsigned_long *)0x0) {
    *in_R8 = 0;
  }
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  peVar3 = std::
           __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x12f7aa);
  GenICam_3_4::gcstring::gcstring(local_90,local_10);
  iVar2 = (*(peVar3->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar3,local_90);
  lVar4 = CONCAT44(extraout_var,iVar2);
  GenICam_3_4::gcstring::~gcstring(local_90);
  local_40 = lVar4;
  if (lVar4 == 0) {
    if ((local_29 & 1) != 0) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_180,"Feature not found: ",&local_181);
      std::operator+(in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0);
      std::invalid_argument::invalid_argument(piVar6,local_160);
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    bVar1 = GenApi_3_4::IsReadable(in_stack_fffffffffffffdd0);
    if (bVar1) {
      if (local_40 == 0) {
        local_1e0 = (long *)0x0;
      }
      else {
        local_1e0 = (long *)__dynamic_cast(local_40,&GenApi_3_4::INode::typeinfo,
                                           &GenApi_3_4::IRegister::typeinfo,0xfffffffffffffffe);
      }
      local_a8 = local_1e0;
      if (local_1e0 == (long *)0x0) {
        if ((local_29 & 1) != 0) {
          local_f2 = 1;
          piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_f0,"Feature not of type register: ",&local_f1);
          std::operator+(in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0);
          std::invalid_argument::invalid_argument(piVar6,local_d0);
          local_f2 = 0;
          __cxa_throw(piVar6,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      else {
        local_b0 = (**(code **)(*local_1e0 + 0x48))(local_1e0,0);
        if (local_28 != (unsigned_long *)0x0) {
          *local_28 = local_b0;
        }
        puVar5 = std::min<unsigned_long>(&local_20,&local_b0);
        local_20 = *puVar5;
        (**(code **)(*local_a8 + 0x40))(local_a8,local_18,local_20,0);
        local_38 = local_20;
      }
    }
    else if ((local_29 & 1) != 0) {
      local_13a = 1;
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_138,"Feature not readable: ",&local_139);
      std::operator+(in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0);
      std::invalid_argument::invalid_argument(piVar6,local_118);
      local_13a = 0;
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return local_38;
}

Assistant:

size_t getRegister(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
  uint8_t *buffer, size_t len, size_t *total, bool exception, bool igncache)
{
  size_t ret=0;

  if (total != 0) *total=0;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsReadable(node))
      {
        GenApi::IRegister *p=dynamic_cast<GenApi::IRegister *>(node);

        if (p != 0)
        {
          size_t n=static_cast<size_t>(p->GetLength());

          if (total) *total=n;

          len=std::min(len, n);
          p->Get(buffer, static_cast<int64_t>(len));
          ret=len;
        }
        else if (exception)
        {
          throw std::invalid_argument(std::string("Feature not of type register: ")+name);
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not readable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}